

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

sexp sexp_make_primitive_env_op(sexp ctx,sexp self,sexp_sint_t n,sexp version)

{
  sexp psVar1;
  sexp psVar2;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  sexp_gc_var_t __sexp_gc_preserver4;
  sexp name;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp sym;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp op;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp e;
  int i;
  sexp tail;
  sexp ctx_00;
  undefined8 self_00;
  undefined8 ctx_01;
  undefined8 ctx_02;
  undefined8 ctx_03;
  undefined8 uVar3;
  undefined8 self_01;
  undefined8 uVar4;
  undefined4 local_24;
  
  uVar4 = &DAT_0000043e;
  memset(&stack0xffffffffffffffc0,0,0x10);
  uVar3 = &DAT_0000043e;
  memset(&stack0xffffffffffffffa8,0,0x10);
  ctx_02 = &DAT_0000043e;
  memset(&stack0xffffffffffffff90,0,0x10);
  memset(&stack0xffffffffffffff78,0,0x10);
  self_01 = (((sexp)in_RDI)->value).context.saves;
  (((sexp)in_RDI)->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffffc0;
  ctx_03 = &stack0xffffffffffffffb8;
  (((sexp)in_RDI)->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffffa8;
  self_00 = &stack0xffffffffffffffa0;
  ctx_01 = (((sexp)in_RDI)->value).context.saves;
  (((sexp)in_RDI)->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffff90;
  tail = (sexp)&stack0xffffffffffffff88;
  ctx_00 = (sexp)(((sexp)in_RDI)->value).context.saves;
  (((sexp)in_RDI)->value).context.saves = (sexp_gc_var_t *)&stack0xffffffffffffff78;
  uVar3 = sexp_make_null_env_op
                    ((sexp)uVar4,(sexp)self_01,(sexp_sint_t)&stack0xffffffffffffffd0,(sexp)uVar3);
  local_24 = 0;
  while (sexp_primitive_opcodes[(int)local_24].op_class != '\0') {
    uVar4 = sexp_copy_opcode(ctx_00,(sexp_opcode_struct *)tail);
    psVar1 = sexp_intern((sexp)in_RDI,(char *)in_RSI,in_RDX);
    psVar2 = sexp_c_string((sexp)ctx_01,(char *)self_00,(sexp_sint_t)psVar1);
    (((sexp)uVar4)->value).type.name = psVar2;
    if ((((((sexp)uVar4)->value).opcode.flags & 2) == 0) ||
       ((((sexp)uVar4)->value).type.cpl == (sexp)0x0)) {
      if ((((sexp)uVar4)->value).flonum_bits[0x58] == '\n') {
        psVar2 = sexp_cons_op((sexp)ctx_01,(sexp)self_00,(sexp_sint_t)psVar1,ctx_00,tail);
        (((sexp)uVar4)->value).type.cpl = psVar2;
      }
    }
    else {
      ctx_02 = sexp_intern((sexp)in_RDI,(char *)in_RSI,in_RDX);
      psVar2 = sexp_env_ref((sexp)ctx_02,(sexp)ctx_01,(sexp)self_00,psVar1);
      (((sexp)uVar4)->value).type.cpl = psVar2;
    }
    if (((((sexp)uVar4)->value).flonum_bits[0x58] == '\v') &&
       ((((sexp)uVar4)->value).type.slots != (sexp)0x0)) {
      psVar1 = sexp_c_string((sexp)ctx_01,(char *)self_00,(sexp_sint_t)psVar1);
      (((sexp)uVar4)->value).type.slots = psVar1;
    }
    sexp_env_define((sexp)ctx_03,(sexp)ctx_02,(sexp)ctx_01,(sexp)self_00);
    local_24 = local_24 + 1;
  }
  (((sexp)in_RDI)->value).context.saves = (sexp_gc_var_t *)self_01;
  return (sexp)uVar3;
}

Assistant:

sexp sexp_make_primitive_env_op (sexp ctx, sexp self, sexp_sint_t n, sexp version) {
  int i;
  sexp_gc_var4(e, op, sym, name);
  sexp_gc_preserve4(ctx, e, op, sym, name);
  e = sexp_make_null_env(ctx, version);
  for (i=0; sexp_primitive_opcodes[i].op_class; i++) {
    op = sexp_copy_opcode(ctx, &sexp_primitive_opcodes[i]);
    name = sexp_intern(ctx, (char*)sexp_opcode_name(op), -1);
    sexp_opcode_name(op) = sexp_c_string(ctx, (char*)sexp_opcode_name(op), -1);
    if (sexp_opcode_opt_param_p(op) && sexp_opcode_data(op)) {
      sym = sexp_intern(ctx, (char*)sexp_opcode_data(op), -1);
      sexp_opcode_data(op) = sexp_env_ref(ctx, e, sym, SEXP_FALSE);
    } else if (sexp_opcode_class(op) == SEXP_OPC_PARAMETER) {
      sexp_opcode_data(op) = sexp_cons(ctx, name, SEXP_FALSE);
    }
    if (sexp_opcode_class(op) == SEXP_OPC_FOREIGN && sexp_opcode_data2(op)) {
      sexp_opcode_data2(op) = sexp_c_string(ctx, (char*)sexp_opcode_data2(op), -1);
    }
    sexp_env_define(ctx, e, name, op);
  }
  sexp_gc_release4(ctx);
  return e;
}